

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int wally_aes_cbc(uchar *key,size_t key_len,uchar *iv,size_t iv_len,uchar *bytes,size_t bytes_len,
                 uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  _Bool _Var1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uchar *puVar7;
  size_t sVar8;
  ulong uVar9;
  uchar buf [16];
  char local_124;
  AES256_ctx ctx;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  _Var1 = are_valid_args(key,key_len,bytes,bytes_len,flags);
  if (!_Var1) {
    return -2;
  }
  if (((byte)flags & (len & 0xf) != 0) != 0) {
    return -2;
  }
  if ((flags & 2) == 0) {
    if (iv_len != 0x10 || iv == (uchar *)0x0) {
      return -2;
    }
  }
  else {
    if (iv_len != 0x10) {
      return -2;
    }
    if (iv == (uchar *)0x0) {
      return -2;
    }
    if ((bytes_len & 0xf) != 0) {
      return -2;
    }
  }
  if (3 < flags || written == (size_t *)0x0) {
    return -2;
  }
  uVar4 = bytes_len >> 4;
  if ((flags & 1) == 0) {
    uVar4 = uVar4 - 1;
    puVar7 = bytes + (bytes_len - 0x20);
    if (uVar4 == 0) {
      puVar7 = iv;
    }
    aes_dec(&ctx,key,key_len,bytes + (bytes_len - 0x10),0x10,buf);
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      buf[lVar2] = buf[lVar2] ^ puVar7[lVar2];
    }
    uVar6 = (ulong)(byte)(0x10 - (buf[0xf] & 0xf));
    if ((buf[0xf] & 0xf) == 0) {
      uVar6 = 0;
    }
    uVar3 = (uint)uVar6;
    sVar8 = uVar6 + uVar4 * 0x10;
  }
  else {
    uVar3 = (uint)bytes_len & 0xffffff0f;
    sVar8 = (bytes_len & 0xfffffffffffffff0) + 0x10;
  }
  *written = sVar8;
  if (sVar8 - 1 < len) {
    if (bytes_out == (uchar *)0x0) {
      iVar5 = -2;
      goto LAB_0041322f;
    }
    uVar6 = (ulong)(uVar3 & 0xff);
    if ((flags & 2) != 0) {
      memcpy(bytes_out + uVar4 * 0x10,buf,uVar6);
    }
    for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
      if ((flags & 1) == 0) {
        aes_dec(&ctx,key,key_len,bytes,0x10,bytes_out);
        for (lVar2 = 0; puVar7 = bytes, lVar2 != 0x10; lVar2 = lVar2 + 1) {
          bytes_out[lVar2] = bytes_out[lVar2] ^ iv[lVar2];
        }
      }
      else {
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          buf[lVar2] = iv[lVar2] ^ bytes[lVar2];
        }
        aes_enc(&ctx,key,key_len,buf,0x10,bytes_out);
        puVar7 = bytes_out;
      }
      bytes = bytes + 0x10;
      bytes_out = bytes_out + 0x10;
      iv = puVar7;
    }
    if ((flags & 1) != 0) {
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        buf[uVar4] = iv[uVar4] ^ bytes[uVar4];
      }
      local_124 = (char)uVar3;
      for (; uVar6 < 0x10; uVar6 = uVar6 + 1) {
        buf[uVar6] = iv[uVar6] ^ 0x10U - local_124;
      }
      aes_enc(&ctx,key,key_len,buf,0x10,bytes_out);
    }
  }
  iVar5 = 0;
LAB_0041322f:
  wally_clear_2(buf,0x10,&ctx,0xf0);
  return iVar5;
}

Assistant:

int wally_aes_cbc(const unsigned char *key, size_t key_len,
                  const unsigned char *iv, size_t iv_len,
                  const unsigned char *bytes, size_t bytes_len,
                  uint32_t flags,
                  unsigned char *bytes_out, size_t len,
                  size_t *written)
{
    unsigned char buf[AES_BLOCK_LEN];
    AES256_ctx ctx;
    size_t i, n, blocks;
    unsigned char remainder;

    if (written)
        *written = 0;

    if (!are_valid_args(key, key_len, bytes, bytes_len, flags) ||
        ((flags & AES_FLAG_ENCRYPT) && (len % AES_BLOCK_LEN)) ||
        ((flags & AES_FLAG_DECRYPT) && (bytes_len % AES_BLOCK_LEN)) ||
        !iv || iv_len != AES_BLOCK_LEN || flags & ~ALL_OPS || !written)
        return WALLY_EINVAL;

    blocks = bytes_len / AES_BLOCK_LEN;

    if (flags & AES_FLAG_ENCRYPT) {
        /* Determine output length from input length */
        remainder = bytes_len % AES_BLOCK_LEN;
        *written = (blocks + 1) * AES_BLOCK_LEN;
    } else {
        /* Determine output length from decrypted final block */
        const unsigned char *last = bytes + bytes_len - AES_BLOCK_LEN;
        const unsigned char *prev = last - AES_BLOCK_LEN;

        if (!--blocks)
            prev = iv;
        aes_dec(&ctx, key, key_len, last, AES_BLOCK_LEN, buf);
        for (n = 0; n < AES_BLOCK_LEN; ++n)
            buf[n] = prev[n] ^ buf[n];

        /* Modulo the resulting padding amount to the block size - we do
         * not attempt to verify the decryption by checking the padding in
         * the decrypted block. */
        remainder = AES_BLOCK_LEN - (buf[AES_BLOCK_LEN - 1] % AES_BLOCK_LEN);
        if (remainder == AES_BLOCK_LEN)
            remainder = 0;
        *written = blocks * AES_BLOCK_LEN + remainder;
    }
    if (len < *written || !*written)
        goto finish; /* Inform caller how much space is needed */

    if (!bytes_out) {
        wally_clear_2(buf, sizeof(buf), &ctx, sizeof(ctx));
        return WALLY_EINVAL;
    }

    if (flags & AES_FLAG_DECRYPT)
        memcpy(bytes_out + blocks * AES_BLOCK_LEN, buf, remainder);

    for (i = 0; i < blocks; ++i) {
        if (flags & AES_FLAG_ENCRYPT) {
            for (n = 0; n < AES_BLOCK_LEN; ++n)
                buf[n] = bytes[n] ^ iv[n];
            aes_enc(&ctx, key, key_len, buf, AES_BLOCK_LEN, bytes_out);
            iv = bytes_out;
        } else {
            aes_dec(&ctx, key, key_len, bytes, AES_BLOCK_LEN, bytes_out);
            for (n = 0; n < AES_BLOCK_LEN; ++n)
                bytes_out[n] = bytes_out[n] ^ iv[n];
            iv = bytes;
        }
        bytes += AES_BLOCK_LEN;
        bytes_out += AES_BLOCK_LEN;
    }

    if (flags & AES_FLAG_ENCRYPT) {
        for (n = 0; n < remainder; ++n)
            buf[n] = bytes[n] ^ iv[n];
        remainder = 16 - remainder;
        for (; n < AES_BLOCK_LEN; ++n)
            buf[n] = remainder ^ iv[n];
        aes_enc(&ctx, key, key_len, buf, AES_BLOCK_LEN, bytes_out);
    }

finish:
    wally_clear_2(buf, sizeof(buf), &ctx, sizeof(ctx));
    return WALLY_OK;
}